

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

bool nivalis::anon_unknown_0::check_for_cycle
               (vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                *funcs,uint64_t fid)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 uVar4;
  vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
  *in_RSI;
  vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
  *in_RDI;
  long *in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar5;
  uint64_t dep_fid;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa8;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffb0;
  value_type *in_stack_ffffffffffffffb8;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_30;
  _Node_iterator_base<unsigned_long,_false> local_28;
  undefined7 in_stack_ffffffffffffffe1;
  bool local_1;
  
  if ((char)in_FS_OFFSET[-0x87] == '\0') {
    in_stack_ffffffffffffffb0 =
         (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)(*in_FS_OFFSET + -0x470);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)0x10a034);
    __cxa_thread_atexit(std::
                        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::~unordered_set,in_stack_ffffffffffffffb0,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x87) = 1;
  }
  sVar2 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::count(in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8);
  if (sVar2 == 0) {
    pVar5 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::insert(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_28._M_cur =
         (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
    uVar4 = pVar5.second;
    pvVar3 = std::
             vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
             ::operator[](in_RDI,(size_type)in_RSI);
    local_30 = &pvVar3->deps;
    local_38._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_ffffffffffffffa8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(&local_38);
      bVar1 = check_for_cycle(in_RSI,CONCAT71(in_stack_ffffffffffffffe1,uVar4));
      if (bVar1) {
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::erase(in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8);
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_38);
    }
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::erase(in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8);
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool check_for_cycle(const std::vector<Environment::UserFunction>& funcs,
                     uint64_t fid) {
    thread_local std::unordered_set<uint64_t> seen;
    if (seen.count(fid)) return true;
    seen.insert(fid);
    for (uint64_t dep_fid : funcs[fid].deps) {
        if (check_for_cycle(funcs, dep_fid)) {
            seen.erase(fid);
            return true;
        }
    }
    seen.erase(fid);
    return false;
}